

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

void ZiAllocScratchs(hs_database_t *db,hs_scratch_t **sc,int sc_len,char *info)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  int local_30;
  int i;
  hs_error_t err;
  char *info_local;
  int sc_len_local;
  hs_scratch_t **sc_local;
  hs_database_t *db_local;
  
  *sc = (hs_scratch_t *)0x0;
  iVar1 = hs_alloc_scratch(db,sc);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] ");
    poVar2 = std::operator<<(poVar2,info);
    poVar2 = std::operator<<(poVar2," HS-Alloc Failed: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  local_30 = 1;
  while( true ) {
    if (sc_len <= local_30) {
      return;
    }
    iVar1 = hs_clone_scratch(*sc,sc + local_30);
    if (iVar1 != 0) break;
    local_30 = local_30 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] ");
  poVar2 = std::operator<<(poVar2,info);
  poVar2 = std::operator<<(poVar2," HS-Clone Failed: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void ZiAllocScratchs(const hs_database_t* db, hs_scratch_t** sc, int sc_len,
    const char* info)
{
    hs_error_t err;

    sc[0] = nullptr;
    err = hs_alloc_scratch(db, &sc[0]);
    if (err != HS_SUCCESS)
    {
        cerr << "[ ERROR ] " << info << " HS-Alloc Failed: " << err << endl;
        exit(-1);
    }

    for (int i = 1; i < sc_len; i++)
    {
        err = hs_clone_scratch(sc[0], &sc[i]);
        if (err != HS_SUCCESS)
        {
            cerr << "[ ERROR ] " << info << " HS-Clone Failed: " << err << endl;
            exit(-1);
        }
    }
}